

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  char *digits;
  appender aVar5;
  byte *pbVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  char *digits_1;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  detail *pdVar14;
  long lVar15;
  long lVar16;
  appender it;
  bool bVar17;
  bool bVar18;
  format_decimal_result<char_*> fVar19;
  undefined8 in_stack_ffffffffffffff38;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar20;
  undefined1 local_b8 [40];
  ulong local_90;
  int local_88;
  bool local_84;
  
  pVar1 = specs->type;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    lVar16 = 0;
    lVar15 = 1;
    local_88 = 0;
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    do {
      local_88 = local_88 + 1;
      uVar3 = uVar9 << 0x3d;
      lVar15 = lVar15 + -1;
      lVar16 = lVar16 + -1;
      bVar17 = (detail *)0x7 < pdVar14;
      bVar18 = uVar9 != 0;
      uVar4 = -uVar9;
      uVar9 = uVar9 >> 3;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 3);
    } while (bVar18 || uVar4 < bVar17);
    iVar2 = specs->precision;
    if (((char)*(ushort *)&specs->field_0x9 < '\0') &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) && iVar2 <= local_88)
       ) {
      uVar13 = 0x3000;
      if (arg.prefix == 0) {
        uVar13 = 0x30;
      }
      arg.prefix = (uVar13 | arg.prefix) + 0x1000000;
    }
    uVar13 = specs->width;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((arg.prefix != 0) && (uVar13 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar9 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar9) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar9 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar9;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar17 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar17);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar8 - lVar16;
      if (uVar9 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar6 = (byte *)((*(long *)((long)out.
                                             super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                             .container + 8) + lVar8) - lVar15);
          do {
            uVar9 = arg.abs_value._8_8_ << 0x3d;
            *pbVar6 = (byte)(detail *)arg.abs_value & 7 | 0x30;
            pbVar6 = pbVar6 + -1;
            bVar17 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
            arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
          } while (bVar17);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pbVar6 = local_b8 + -lVar15;
      pcVar7 = local_b8 + -lVar16;
      do {
        *pbVar6 = (byte)(detail *)arg.abs_value & 7 | 0x30;
        uVar9 = arg.abs_value._8_8_ << 0x3d;
        pbVar6 = pbVar6 + -1;
        bVar17 = (detail *)0x7 < (detail *)arg.abs_value;
        bVar18 = arg.abs_value._8_8_ != 0;
        uVar3 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar18 || uVar3 < bVar17);
      goto LAB_001280ec;
    }
    uVar10 = (arg.prefix >> 0x18) + local_88;
    local_b8._8_8_ = ZEXT48(uVar10);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar10 < uVar13) {
        local_b8._16_8_ = (ulong)uVar13 - local_b8._8_8_;
        local_b8._8_8_ = (ulong)uVar13;
        goto LAB_00128074;
      }
    }
    else {
      local_b8._16_8_ = ZEXT48((uint)(iVar2 - local_88));
      if (iVar2 - local_88 != 0 && local_88 <= iVar2) {
        local_b8._8_8_ = ZEXT48(iVar2 + (arg.prefix >> 0x18));
        goto LAB_00128074;
      }
    }
    local_b8._16_8_ = 0;
LAB_00128074:
    local_b8._32_8_ = (detail *)arg.abs_value;
    local_90 = arg.abs_value._8_8_;
    local_b8._0_4_ = arg.prefix;
    aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_b8._8_8_,local_b8._8_8_,(anon_class_64_3_4ecd7a16 *)local_b8)
    ;
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    local_84 = pVar1 == hex_upper;
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar10 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar13 = uVar10 << 8;
      if (arg.prefix == 0) {
        uVar13 = uVar10;
      }
      arg.prefix = (uVar13 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar3 = uVar9 << 0x3c;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0xf < pdVar14;
      bVar18 = uVar9 != 0;
      uVar4 = -uVar9;
      uVar9 = uVar9 >> 4;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 4);
    } while (bVar18 || uVar4 < bVar17);
    uVar13 = specs->width;
    iVar2 = specs->precision;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((arg.prefix != 0) && (uVar13 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar9 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar9) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar9 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar9;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar17 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar17);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar8 + lVar15;
      if (uVar9 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pcVar7 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar7 = "0123456789ABCDEF";
          }
          pcVar11 = (char *)(*(long *)((long)out.
                                             super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                             .container + 8) + lVar8 + lVar15);
          do {
            pcVar11 = pcVar11 + -1;
            uVar9 = arg.abs_value._8_8_ << 0x3c;
            *pcVar11 = pcVar7[(uint)(detail *)arg.abs_value & 0xf];
            bVar17 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
            arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 4);
          } while (bVar17);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar11 = local_b8 + lVar16;
      pcVar7 = local_b8 + lVar16 + 1;
      pcVar12 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar12 = "0123456789ABCDEF";
      }
      do {
        *pcVar11 = pcVar12[(uint)(detail *)arg.abs_value & 0xf];
        uVar9 = arg.abs_value._8_8_ << 0x3c;
        pcVar11 = pcVar11 + -1;
        bVar17 = (detail *)0xf < (detail *)arg.abs_value;
        bVar18 = arg.abs_value._8_8_ != 0;
        uVar3 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar18 || uVar3 < bVar17);
      goto LAB_001280ec;
    }
    uVar10 = arg.prefix >> 0x18;
    local_b8._8_8_ = (ulong)uVar10 + lVar15;
    local_88 = (int)lVar15;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)local_b8._8_8_ < uVar13) {
        local_b8._16_8_ = ((ulong)uVar13 - (ulong)uVar10) - lVar15;
        local_b8._8_8_ = (ulong)uVar13;
        goto LAB_00127e41;
      }
    }
    else if (local_88 < iVar2) {
      local_b8._8_8_ = ZEXT48(uVar10 + iVar2);
      local_b8._16_8_ = ZEXT48((uint)(iVar2 - local_88));
      goto LAB_00127e41;
    }
    local_b8._16_8_ = 0;
LAB_00127e41:
    local_b8._32_8_ = (detail *)arg.abs_value;
    local_90 = arg.abs_value._8_8_;
    local_b8._0_4_ = arg.prefix;
    aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_b8._8_8_,local_b8._8_8_,(anon_class_64_3_4ecd7a16 *)local_b8)
    ;
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar10 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar13 = uVar10 << 8;
      if (arg.prefix == 0) {
        uVar13 = uVar10;
      }
      arg.prefix = (uVar13 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar3 = uVar9 << 0x3f;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0x1 < pdVar14;
      bVar18 = uVar9 != 0;
      uVar4 = -uVar9;
      uVar9 = uVar9 >> 1;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 1);
    } while (bVar18 || uVar4 < bVar17);
    uVar13 = specs->width;
    iVar2 = specs->precision;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((arg.prefix != 0) && (uVar13 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          uVar9 = lVar8 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar9) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x10);
            uVar9 = lVar8 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar9;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar17 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar17);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar8 + lVar15;
      if (uVar9 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar6 = (byte *)(*(long *)((long)out.
                                            super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                            .container + 8) + lVar8 + lVar15);
          do {
            pbVar6 = pbVar6 + -1;
            uVar9 = arg.abs_value._8_8_ << 0x3f;
            *pbVar6 = (byte)(detail *)arg.abs_value & 1 | 0x30;
            bVar17 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
            arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
          } while (bVar17);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pbVar6 = local_b8 + lVar16;
      pcVar7 = local_b8 + lVar16 + 1;
      do {
        *pbVar6 = (byte)(detail *)arg.abs_value & 1 | 0x30;
        uVar9 = arg.abs_value._8_8_ << 0x3f;
        pbVar6 = pbVar6 + -1;
        bVar17 = (detail *)0x1 < (detail *)arg.abs_value;
        bVar18 = arg.abs_value._8_8_ != 0;
        uVar3 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar18 || uVar3 < bVar17);
      goto LAB_001280ec;
    }
    uVar10 = arg.prefix >> 0x18;
    local_b8._8_8_ = (ulong)uVar10 + lVar15;
    local_88 = (int)lVar15;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)local_b8._8_8_ < uVar13) {
        local_b8._16_8_ = ((ulong)uVar13 - (ulong)uVar10) - lVar15;
        local_b8._8_8_ = (ulong)uVar13;
        goto LAB_00127e00;
      }
    }
    else if (local_88 < iVar2) {
      local_b8._8_8_ = ZEXT48(uVar10 + iVar2);
      local_b8._16_8_ = ZEXT48((uint)(iVar2 - local_88));
      goto LAB_00127e00;
    }
    local_b8._16_8_ = 0;
LAB_00127e00:
    local_b8._32_8_ = (detail *)arg.abs_value;
    local_90 = arg.abs_value._8_8_;
    local_b8._0_4_ = arg.prefix;
    aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_b8._8_8_,local_b8._8_8_,(anon_class_64_3_4ecd7a16 *)local_b8)
    ;
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_b8._0_4_ = (uint)CONCAT21(local_b8._2_2_,(char)arg.abs_value) << 8;
    aVar5 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_b8);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  if (((specs->field_0xa & 1) != 0) &&
     (value._8_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
     value._0_8_ = in_stack_ffffffffffffff38,
     bVar17 = write_int_localized<fmt::v9::appender,unsigned__int128,char>
                        ((detail *)&stack0xffffffffffffff40,(appender *)(detail *)arg.abs_value,
                         (unsigned___int128)value,arg.abs_value._8_4_,
                         (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), bVar17))
  {
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  n._8_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  n._0_8_ = in_stack_ffffffffffffff38;
  local_88 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
  uVar13 = specs->width;
  iVar2 = specs->precision;
  if (iVar2 == -1 && uVar13 == 0) {
    bVar20 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    if ((arg.prefix != 0) &&
       (uVar13 = arg.prefix & 0xffffff,
       ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
      do {
        lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                 container + 0x10);
        uVar9 = lVar15 + 1;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) < uVar9) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x10);
          uVar9 = lVar15 + 1;
        }
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar15) = (char)uVar13;
        bVar17 = 0xff < uVar13;
        uVar13 = uVar13 >> 8;
      } while (bVar17);
    }
    value_00._8_8_ = bVar20.container;
    value_00._0_8_ = in_stack_ffffffffffffff38;
    fVar19 = format_decimal<char,unsigned__int128>
                       ((detail *)local_b8,(char *)(detail *)arg.abs_value,
                        (unsigned___int128)value_00,arg.abs_value._8_4_);
    pcVar7 = fVar19.end;
LAB_001280ec:
    aVar5 = copy_str_noinline<char,char*,fmt::v9::appender>(local_b8,pcVar7,out);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  uVar10 = (arg.prefix >> 0x18) + local_88;
  local_b8._8_8_ = ZEXT48(uVar10);
  if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
    if (uVar10 < uVar13) {
      local_b8._16_8_ = (ulong)uVar13 - local_b8._8_8_;
      local_b8._8_8_ = (ulong)uVar13;
      goto LAB_00127f9a;
    }
  }
  else {
    local_b8._16_8_ = ZEXT48((uint)(iVar2 - local_88));
    if (iVar2 - local_88 != 0 && local_88 <= iVar2) {
      local_b8._8_8_ = ZEXT48(iVar2 + (arg.prefix >> 0x18));
      goto LAB_00127f9a;
    }
  }
  local_b8._16_8_ = 0;
LAB_00127f9a:
  local_b8._0_4_ = arg.prefix;
  local_b8._32_8_ = (detail *)arg.abs_value;
  local_90 = arg.abs_value._8_8_;
  aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned__int128>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned__int128>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                    (out,specs,local_b8._8_8_,local_b8._8_8_,(anon_class_64_3_4ecd7a16 *)local_b8);
  return (appender)
         aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}